

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage(BayesianGameForDecPOMDPStage *this)

{
  BayesianGameForDecPOMDPStage *in_stack_00000010;
  
  ~BayesianGameForDecPOMDPStage(in_stack_00000010);
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage()
{
    //free all the joint beliefs:
    std::vector< JointBeliefInterface* >::iterator it =  _m_JBs.begin();
    std::vector< JointBeliefInterface* >::iterator last =  _m_JBs.end();
    while(it != last)
    {
        delete *it;
        it++;
    }
}